

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  const_reference pvVar3;
  float *pfVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Allocator *in_RDI;
  double dVar5;
  int i_2;
  float *var;
  int i_1;
  float *box_1;
  float ar;
  int p;
  float max_size;
  float min_size;
  int k;
  float box_h;
  float box_w;
  int j;
  float center_y;
  float center_x;
  float *box;
  int i;
  Mat *top_blob;
  int num_prior;
  int num_aspect_ratio;
  int num_max_size;
  int num_min_size;
  float step_h;
  float step_w;
  int image_h;
  int image_w;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar6;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float local_98;
  int local_94;
  float *local_90;
  float local_88;
  int local_84;
  float local_80;
  float local_7c;
  int local_78;
  float local_74;
  float local_70;
  int local_6c;
  float local_68;
  float local_64;
  float *local_60;
  int local_54;
  reference local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_24 = pvVar3->w;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_10,0);
  local_28 = pvVar3->h;
  local_2c = *(int *)(in_RDI + 0x140);
  local_30 = *(int *)(in_RDI + 0x144);
  if (local_2c == -0xe9) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_10,1);
    local_2c = pvVar3->w;
  }
  if (local_30 == -0xe9) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_10,1);
    local_30 = pvVar3->h;
  }
  local_34 = *(float *)(in_RDI + 0x148);
  local_38 = *(float *)(in_RDI + 0x14c);
  if ((local_34 == -233.0) && (!NAN(local_34))) {
    local_34 = (float)local_2c / (float)local_24;
  }
  if ((local_38 == -233.0) && (!NAN(local_38))) {
    local_38 = (float)local_30 / (float)local_28;
  }
  local_3c = *(int *)(in_RDI + 0xa4);
  local_40 = *(int *)(in_RDI + 0xdc);
  local_44 = *(int *)(in_RDI + 0x114);
  local_48 = local_3c * local_44 + local_3c + local_40;
  if (*(int *)(in_RDI + 0x138) != 0) {
    local_48 = local_3c * local_44 + local_48;
  }
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58,
              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_RDI);
  for (local_54 = 0; local_54 < local_28; local_54 = local_54 + 1) {
    local_60 = Mat::operator_cast_to_float_(local_50);
    local_60 = local_60 + local_54 * local_24 * local_48 * 4;
    local_64 = *(float *)(in_RDI + 0x150) * local_34;
    local_68 = *(float *)(in_RDI + 0x150) * local_38 + (float)local_54 * local_38;
    for (local_6c = 0; local_6c < local_24; local_6c = local_6c + 1) {
      for (local_78 = 0; local_78 < local_3c; local_78 = local_78 + 1) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x80),local_78);
        local_7c = *pfVar4;
        *local_60 = (local_64 - local_7c * 0.5) / (float)local_2c;
        local_60[1] = (local_68 - local_7c * 0.5) / (float)local_30;
        local_60[2] = (local_64 + local_7c * 0.5) / (float)local_2c;
        local_60[3] = (local_68 + local_7c * 0.5) / (float)local_30;
        local_60 = local_60 + 4;
        local_70 = local_7c;
        if (0 < local_40) {
          local_74 = local_7c;
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xb8),local_78);
          local_80 = *pfVar4;
          dVar5 = std::sqrt((double)(ulong)(uint)(local_7c * local_80));
          local_70 = SUB84(dVar5,0);
          *local_60 = (local_64 - local_70 * 0.5) / (float)local_2c;
          local_60[1] = (local_68 - local_70 * 0.5) / (float)local_30;
          local_60[2] = (local_64 + local_70 * 0.5) / (float)local_2c;
          local_60[3] = (local_68 + local_70 * 0.5) / (float)local_30;
          local_60 = local_60 + 4;
        }
        local_74 = local_70;
        for (local_84 = 0; local_84 < local_44; local_84 = local_84 + 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xf0),local_84);
          fVar1 = local_7c;
          local_88 = *pfVar4;
          dVar5 = std::sqrt((double)(ulong)(uint)local_88);
          fVar2 = local_7c;
          local_70 = fVar1 * SUB84(dVar5,0);
          dVar5 = std::sqrt((double)(ulong)(uint)local_88);
          local_74 = fVar2 / SUB84(dVar5,0);
          *local_60 = (local_64 - local_70 * 0.5) / (float)local_2c;
          local_60[1] = (local_68 - local_74 * 0.5) / (float)local_30;
          local_60[2] = (local_64 + local_70 * 0.5) / (float)local_2c;
          local_60[3] = (local_68 + local_74 * 0.5) / (float)local_30;
          pfVar4 = local_60 + 4;
          if (*(int *)(in_RDI + 0x138) != 0) {
            local_60[4] = (local_64 - local_74 * 0.5) / (float)local_2c;
            local_60[5] = (local_68 - local_70 * 0.5) / (float)local_30;
            local_60[6] = (local_64 + local_74 * 0.5) / (float)local_2c;
            local_60[7] = (local_68 + local_70 * 0.5) / (float)local_30;
            pfVar4 = local_60 + 8;
          }
          local_60 = pfVar4;
        }
      }
      local_64 = local_34 + local_64;
    }
    local_68 = local_38 + local_68;
  }
  if (*(int *)(in_RDI + 0x13c) != 0) {
    local_90 = Mat::operator_cast_to_float_(local_50);
    for (local_94 = 0; local_94 < local_50->w; local_94 = local_94 + 1) {
      local_98 = 0.0;
      pfVar4 = std::max<float>(local_90 + local_94,&local_98);
      pfVar4 = std::min<float>(pfVar4,(float *)&stack0xffffffffffffff64);
      local_90[local_94] = *pfVar4;
    }
  }
  pfVar4 = Mat::row(local_50,1);
  for (iVar6 = 0; iVar6 < local_50->w / 4; iVar6 = iVar6 + 1) {
    *pfVar4 = *(float *)(in_RDI + 0x128);
    pfVar4[1] = *(float *)(in_RDI + 300);
    pfVar4[2] = *(float *)(in_RDI + 0x130);
    pfVar4[3] = *(float *)(in_RDI + 0x134);
    pfVar4 = pfVar4 + 4;
  }
  return 0;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
        step_w = (float)image_w / w;
    if (step_h == -233)
        step_h = (float)image_h / h;

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }

        center_y += step_h;
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}